

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

uint256 * SignatureHash<CTransaction>
                    (uint256 *__return_storage_ptr__,CScript *scriptCode,CTransaction *txTo,uint nIn
                    ,int32_t nHashType,CAmount *amount,SigVersion sigversion,
                    PrecomputedTransactionData *cache)

{
  pointer pCVar1;
  ulong *puVar2;
  uint uVar3;
  pointer pCVar4;
  base_blob<256U> *pbVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  CScript *pCVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  undefined1 data [8];
  long in_FS_OFFSET;
  bool bVar16;
  HashWriter ss;
  uint256 hashSequence;
  uint256 hashPrevouts;
  uint local_148;
  undefined1 local_138 [8];
  void *pvStack_130;
  uint32_t local_128 [4];
  uchar local_118 [80];
  uint256 local_c8;
  undefined1 local_a8 [8];
  void *pvStack_a0;
  uint32_t local_98 [4];
  char *local_88;
  void *pvStack_80;
  uint32_t local_78 [4];
  undefined1 local_68 [8];
  prevector<28U,_unsigned_char,_unsigned_int,_int> pStack_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar13 = (ulong)nIn;
  uVar8 = ((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  if (uVar8 < uVar13 || uVar8 - uVar13 == 0) {
    __assert_fail("nIn < txTo.vin.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x622,
                  "uint256 SignatureHash(const CScript &, const T &, unsigned int, int32_t, const CAmount &, SigVersion, const PrecomputedTransactionData *) [T = CTransaction]"
                 );
  }
  cVar11 = (char)nHashType;
  if (sigversion == WITNESS_V0) {
    pStack_60._union.indirect_contents.capacity = 0;
    pStack_60._union._12_4_ = 0;
    pStack_60._union._16_8_ = 0;
    local_68 = (undefined1  [8])0x0;
    pStack_60._union._0_8_ = (void *)0x0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78._8_8_ = 0;
    local_88 = (char *)0x0;
    pvStack_80 = (void *)0x0;
    local_98[0] = 0;
    local_98[1] = 0;
    local_98._8_8_ = 0;
    local_a8 = (undefined1  [8])0x0;
    pvStack_a0 = (void *)0x0;
    if (cache == (PrecomputedTransactionData *)0x0) {
      if (cVar11 < '\0') {
        if ((nHashType & 0x1eU) != 2) goto LAB_004193ee;
      }
      else {
LAB_00418f5e:
        anon_unknown.dwarf_187cfb9::GetPrevoutsSHA256<CTransaction>(&local_c8,txTo);
        SHA256Uint256((uint256 *)local_138,&local_c8);
        pStack_60._union.indirect_contents.capacity = local_128[0];
        pStack_60._union._12_4_ = local_128[1];
        pStack_60._union._16_4_ = local_128[2];
        pStack_60._union._20_4_ = local_128[3];
        local_68 = local_138;
        pStack_60._union._0_8_ = pvStack_130;
        if ((nHashType & 0x1eU) != 2) {
          anon_unknown.dwarf_187cfb9::GetSequencesSHA256<CTransaction>(&local_c8,txTo);
          SHA256Uint256((uint256 *)local_138,&local_c8);
          cVar6 = '\0';
          goto LAB_00418fe0;
        }
      }
LAB_0041933d:
      if (((nHashType & 0x1fU) == 3) &&
         (uVar8 = ((long)(txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
         uVar13 <= uVar8 && uVar8 - uVar13 != 0)) {
        local_118[0x30] = '\0';
        local_118[0x31] = '\0';
        local_118[0x32] = '\0';
        local_118[0x33] = '\0';
        local_118[0x34] = '\0';
        local_118[0x35] = '\0';
        local_118[0x36] = '\0';
        local_118[0x37] = '\0';
        local_118[0x38] = '\0';
        local_118[0x39] = '\0';
        local_118[0x3a] = '\0';
        local_118[0x3b] = '\0';
        local_118[0x3c] = '\0';
        local_118[0x3d] = '\0';
        local_118[0x3e] = '\0';
        local_118[0x3f] = '\0';
        local_118[0x20] = '\0';
        local_118[0x21] = '\0';
        local_118[0x22] = '\0';
        local_118[0x23] = '\0';
        local_118[0x24] = '\0';
        local_118[0x25] = '\0';
        local_118[0x26] = '\0';
        local_118[0x27] = '\0';
        local_118[0x28] = '\0';
        local_118[0x29] = '\0';
        local_118[0x2a] = '\0';
        local_118[0x2b] = '\0';
        local_118[0x2c] = '\0';
        local_118[0x2d] = '\0';
        local_118[0x2e] = '\0';
        local_118[0x2f] = '\0';
        local_118[0x10] = '\0';
        local_118[0x11] = '\0';
        local_118[0x12] = '\0';
        local_118[0x13] = '\0';
        local_118[0x14] = '\0';
        local_118[0x15] = '\0';
        local_118[0x16] = '\0';
        local_118[0x17] = '\0';
        local_118[0x18] = '\0';
        local_118[0x19] = '\0';
        local_118[0x1a] = '\0';
        local_118[0x1b] = '\0';
        local_118[0x1c] = '\0';
        local_118[0x1d] = '\0';
        local_118[0x1e] = '\0';
        local_118[0x1f] = '\0';
        local_118[0] = '\0';
        local_118[1] = '\0';
        local_118[2] = '\0';
        local_118[3] = '\0';
        local_118[4] = '\0';
        local_118[5] = '\0';
        local_118[6] = '\0';
        local_118[7] = '\0';
        local_118[8] = '\0';
        local_118[9] = '\0';
        local_118[10] = '\0';
        local_118[0xb] = '\0';
        local_118[0xc] = '\0';
        local_118[0xd] = '\0';
        local_118[0xe] = '\0';
        local_118[0xf] = '\0';
        local_128[0] = 0;
        local_128[1] = 0;
        local_128[2] = 0;
        local_128[3] = 0;
        local_138._0_4_ = 0;
        local_138._4_4_ = 0;
        pvStack_130 = (void *)0x0;
        local_118[0x40] = '\0';
        local_118[0x41] = '\0';
        local_118[0x42] = '\0';
        local_118[0x43] = '\0';
        local_118[0x44] = '\0';
        local_118[0x45] = '\0';
        local_118[0x46] = '\0';
        local_118[0x47] = '\0';
        CSHA256::CSHA256((CSHA256 *)local_138);
        pCVar1 = (txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar13;
        local_c8.super_base_blob<256U>.m_data._M_elems._0_8_ = pCVar1->nValue;
        CSHA256::Write((CSHA256 *)local_138,(uchar *)&local_c8,8);
        SerializeMany<HashWriter,prevector<28u,unsigned_char,unsigned_int,int>>
                  ((HashWriter *)local_138,&(pCVar1->scriptPubKey).super_CScriptBase);
        HashWriter::GetHash((uint256 *)local_a8,(HashWriter *)local_138);
      }
    }
    else {
      cVar6 = cache->m_bip143_segwit_ready;
      if (cVar11 < '\0') {
        bVar16 = (nHashType & 0x1eU) == 2;
      }
      else {
        if ((bool)cVar6 == false) goto LAB_00418f5e;
        local_68 = *(undefined1 (*) [8])(cache->hashPrevouts).super_base_blob<256U>.m_data._M_elems;
        pStack_60._union.indirect_contents.indirect =
             (char *)*(undefined8 *)
                      ((cache->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 8);
        pStack_60._union._8_8_ =
             *(undefined8 *)((cache->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 0x10);
        pStack_60._union._16_8_ =
             *(undefined8 *)((cache->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 0x18);
        if ((nHashType & 0x1eU) == 2) goto LAB_0041933d;
        local_138 = *(undefined1 (*) [8])(cache->hashSequence).super_base_blob<256U>.m_data._M_elems
        ;
        pvStack_130 = *(void **)((cache->hashSequence).super_base_blob<256U>.m_data._M_elems + 8);
        local_128._0_8_ =
             *(undefined8 *)((cache->hashSequence).super_base_blob<256U>.m_data._M_elems + 0x10);
        local_128._8_8_ =
             *(undefined8 *)((cache->hashSequence).super_base_blob<256U>.m_data._M_elems + 0x18);
        cVar6 = '\x01';
LAB_00418fe0:
        local_78[0] = local_128[0];
        local_78[1] = local_128[1];
        local_78[2] = local_128[2];
        local_78[3] = local_128[3];
        local_88 = (char *)local_138;
        pvStack_80 = pvStack_130;
        bVar16 = false;
      }
      if (bVar16) goto LAB_0041933d;
      if (cVar6 == '\0') {
LAB_004193ee:
        anon_unknown.dwarf_187cfb9::GetOutputsSHA256<CTransaction>(&local_c8,txTo);
        SHA256Uint256((uint256 *)local_138,&local_c8);
      }
      else {
        local_138 = *(undefined1 (*) [8])(cache->hashOutputs).super_base_blob<256U>.m_data._M_elems;
        pvStack_130 = *(void **)((cache->hashOutputs).super_base_blob<256U>.m_data._M_elems + 8);
        local_128._0_8_ =
             *(undefined8 *)((cache->hashOutputs).super_base_blob<256U>.m_data._M_elems + 0x10);
        local_128._8_8_ =
             *(undefined8 *)((cache->hashOutputs).super_base_blob<256U>.m_data._M_elems + 0x18);
      }
      local_98[0] = local_128[0];
      local_98[1] = local_128[1];
      local_98[2] = local_128[2];
      local_98[3] = local_128[3];
      local_a8 = local_138;
      pvStack_a0 = pvStack_130;
    }
    local_118[0x30] = '\0';
    local_118[0x31] = '\0';
    local_118[0x32] = '\0';
    local_118[0x33] = '\0';
    local_118[0x34] = '\0';
    local_118[0x35] = '\0';
    local_118[0x36] = '\0';
    local_118[0x37] = '\0';
    local_118[0x38] = '\0';
    local_118[0x39] = '\0';
    local_118[0x3a] = '\0';
    local_118[0x3b] = '\0';
    local_118[0x3c] = '\0';
    local_118[0x3d] = '\0';
    local_118[0x3e] = '\0';
    local_118[0x3f] = '\0';
    local_118[0x20] = '\0';
    local_118[0x21] = '\0';
    local_118[0x22] = '\0';
    local_118[0x23] = '\0';
    local_118[0x24] = '\0';
    local_118[0x25] = '\0';
    local_118[0x26] = '\0';
    local_118[0x27] = '\0';
    local_118[0x28] = '\0';
    local_118[0x29] = '\0';
    local_118[0x2a] = '\0';
    local_118[0x2b] = '\0';
    local_118[0x2c] = '\0';
    local_118[0x2d] = '\0';
    local_118[0x2e] = '\0';
    local_118[0x2f] = '\0';
    local_118[0x10] = '\0';
    local_118[0x11] = '\0';
    local_118[0x12] = '\0';
    local_118[0x13] = '\0';
    local_118[0x14] = '\0';
    local_118[0x15] = '\0';
    local_118[0x16] = '\0';
    local_118[0x17] = '\0';
    local_118[0x18] = '\0';
    local_118[0x19] = '\0';
    local_118[0x1a] = '\0';
    local_118[0x1b] = '\0';
    local_118[0x1c] = '\0';
    local_118[0x1d] = '\0';
    local_118[0x1e] = '\0';
    local_118[0x1f] = '\0';
    local_118[0] = '\0';
    local_118[1] = '\0';
    local_118[2] = '\0';
    local_118[3] = '\0';
    local_118[4] = '\0';
    local_118[5] = '\0';
    local_118[6] = '\0';
    local_118[7] = '\0';
    local_118[8] = '\0';
    local_118[9] = '\0';
    local_118[10] = '\0';
    local_118[0xb] = '\0';
    local_118[0xc] = '\0';
    local_118[0xd] = '\0';
    local_118[0xe] = '\0';
    local_118[0xf] = '\0';
    local_128[0] = 0;
    local_128[1] = 0;
    local_128._8_8_ = 0;
    local_138 = (undefined1  [8])0x0;
    pvStack_130 = (void *)0x0;
    local_118[0x40] = '\0';
    local_118[0x41] = '\0';
    local_118[0x42] = '\0';
    local_118[0x43] = '\0';
    local_118[0x44] = '\0';
    local_118[0x45] = '\0';
    local_118[0x46] = '\0';
    local_118[0x47] = '\0';
    CSHA256::CSHA256((CSHA256 *)local_138);
    local_c8.super_base_blob<256U>.m_data._M_elems._0_4_ = txTo->version;
    CSHA256::Write((CSHA256 *)local_138,(uchar *)&local_c8,4);
    CSHA256::Write((CSHA256 *)local_138,local_68,0x20);
    CSHA256::Write((CSHA256 *)local_138,(uchar *)&local_88,0x20);
    pCVar4 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    CSHA256::Write((CSHA256 *)local_138,(uchar *)(pCVar4 + uVar13),0x20);
    local_c8.super_base_blob<256U>.m_data._M_elems._0_4_ = pCVar4[uVar13].prevout.n;
    CSHA256::Write((CSHA256 *)local_138,(uchar *)&local_c8,4);
    SerializeMany<HashWriter,prevector<28u,unsigned_char,unsigned_int,int>>
              ((HashWriter *)local_138,&scriptCode->super_CScriptBase);
    local_c8.super_base_blob<256U>.m_data._M_elems._0_8_ = *amount;
    CSHA256::Write((CSHA256 *)local_138,(uchar *)&local_c8,8);
    local_c8.super_base_blob<256U>.m_data._M_elems._0_4_ =
         (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start[uVar13].nSequence;
    CSHA256::Write((CSHA256 *)local_138,(uchar *)&local_c8,4);
    CSHA256::Write((CSHA256 *)local_138,local_a8,0x20);
    local_c8.super_base_blob<256U>.m_data._M_elems._0_4_ = txTo->nLockTime;
    CSHA256::Write((CSHA256 *)local_138,(uchar *)&local_c8,4);
    local_c8.super_base_blob<256U>.m_data._M_elems._0_4_ = nHashType;
    CSHA256::Write((CSHA256 *)local_138,(uchar *)&local_c8,4);
  }
  else {
    uVar7 = nHashType & 0x1f;
    if ((uVar7 == 3) &&
       (uVar8 = ((long)(txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
       uVar8 < uVar13 || uVar8 - uVar13 == 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        pbVar5 = &__return_storage_ptr__->super_base_blob<256U>;
        (pbVar5->m_data)._M_elems[0x10] = '\0';
        (pbVar5->m_data)._M_elems[0x11] = '\0';
        (pbVar5->m_data)._M_elems[0x12] = '\0';
        (pbVar5->m_data)._M_elems[0x13] = '\0';
        (pbVar5->m_data)._M_elems[0x14] = '\0';
        (pbVar5->m_data)._M_elems[0x15] = '\0';
        (pbVar5->m_data)._M_elems[0x16] = '\0';
        (pbVar5->m_data)._M_elems[0x17] = '\0';
        pbVar5 = &__return_storage_ptr__->super_base_blob<256U>;
        (pbVar5->m_data)._M_elems[0x18] = '\0';
        (pbVar5->m_data)._M_elems[0x19] = '\0';
        (pbVar5->m_data)._M_elems[0x1a] = '\0';
        (pbVar5->m_data)._M_elems[0x1b] = '\0';
        (pbVar5->m_data)._M_elems[0x1c] = '\0';
        (pbVar5->m_data)._M_elems[0x1d] = '\0';
        (pbVar5->m_data)._M_elems[0x1e] = '\0';
        (pbVar5->m_data)._M_elems[0x1f] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\x01';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
        pbVar5 = &__return_storage_ptr__->super_base_blob<256U>;
        (pbVar5->m_data)._M_elems[8] = '\0';
        (pbVar5->m_data)._M_elems[9] = '\0';
        (pbVar5->m_data)._M_elems[10] = '\0';
        (pbVar5->m_data)._M_elems[0xb] = '\0';
        (pbVar5->m_data)._M_elems[0xc] = '\0';
        (pbVar5->m_data)._M_elems[0xd] = '\0';
        (pbVar5->m_data)._M_elems[0xe] = '\0';
        (pbVar5->m_data)._M_elems[0xf] = '\0';
        return __return_storage_ptr__;
      }
      goto LAB_00419775;
    }
    local_118[0x30] = '\0';
    local_118[0x31] = '\0';
    local_118[0x32] = '\0';
    local_118[0x33] = '\0';
    local_118[0x34] = '\0';
    local_118[0x35] = '\0';
    local_118[0x36] = '\0';
    local_118[0x37] = '\0';
    local_118[0x38] = '\0';
    local_118[0x39] = '\0';
    local_118[0x3a] = '\0';
    local_118[0x3b] = '\0';
    local_118[0x3c] = '\0';
    local_118[0x3d] = '\0';
    local_118[0x3e] = '\0';
    local_118[0x3f] = '\0';
    local_118[0x20] = '\0';
    local_118[0x21] = '\0';
    local_118[0x22] = '\0';
    local_118[0x23] = '\0';
    local_118[0x24] = '\0';
    local_118[0x25] = '\0';
    local_118[0x26] = '\0';
    local_118[0x27] = '\0';
    local_118[0x28] = '\0';
    local_118[0x29] = '\0';
    local_118[0x2a] = '\0';
    local_118[0x2b] = '\0';
    local_118[0x2c] = '\0';
    local_118[0x2d] = '\0';
    local_118[0x2e] = '\0';
    local_118[0x2f] = '\0';
    local_118[0x10] = '\0';
    local_118[0x11] = '\0';
    local_118[0x12] = '\0';
    local_118[0x13] = '\0';
    local_118[0x14] = '\0';
    local_118[0x15] = '\0';
    local_118[0x16] = '\0';
    local_118[0x17] = '\0';
    local_118[0x18] = '\0';
    local_118[0x19] = '\0';
    local_118[0x1a] = '\0';
    local_118[0x1b] = '\0';
    local_118[0x1c] = '\0';
    local_118[0x1d] = '\0';
    local_118[0x1e] = '\0';
    local_118[0x1f] = '\0';
    local_118[0] = '\0';
    local_118[1] = '\0';
    local_118[2] = '\0';
    local_118[3] = '\0';
    local_118[4] = '\0';
    local_118[5] = '\0';
    local_118[6] = '\0';
    local_118[7] = '\0';
    local_118[8] = '\0';
    local_118[9] = '\0';
    local_118[10] = '\0';
    local_118[0xb] = '\0';
    local_118[0xc] = '\0';
    local_118[0xd] = '\0';
    local_118[0xe] = '\0';
    local_118[0xf] = '\0';
    local_128[0] = 0;
    local_128[1] = 0;
    local_128._8_8_ = 0;
    local_138 = (undefined1  [8])0x0;
    pvStack_130 = (void *)0x0;
    local_118[0x40] = '\0';
    local_118[0x41] = '\0';
    local_118[0x42] = '\0';
    local_118[0x43] = '\0';
    local_118[0x44] = '\0';
    local_118[0x45] = '\0';
    local_118[0x46] = '\0';
    local_118[0x47] = '\0';
    CSHA256::CSHA256((CSHA256 *)local_138);
    local_68._0_4_ = txTo->version;
    CSHA256::Write((CSHA256 *)local_138,local_68,4);
    if (cVar11 < '\0') {
      local_68[0] = 1;
      CSHA256::Write((CSHA256 *)local_138,local_68,1);
      local_148 = 1;
LAB_00419025:
      uVar12 = 0;
      do {
        uVar8 = (ulong)nIn;
        if (-1 < cVar11) {
          uVar8 = (ulong)uVar12;
        }
        pCVar4 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        CSHA256::Write((CSHA256 *)local_138,(uchar *)(pCVar4 + uVar8),0x20);
        local_68._0_4_ = pCVar4[uVar8].prevout.n;
        CSHA256::Write((CSHA256 *)local_138,(uchar *)local_68,4);
        if ((uint)uVar8 == nIn) {
          uVar3 = (scriptCode->super_CScriptBase)._size;
          uVar9 = uVar3 - 0x1d;
          data = (undefined1  [8])*(CScript **)&(scriptCode->super_CScriptBase)._union;
          if (uVar3 < 0x1d) {
            uVar9 = uVar3;
            data = (undefined1  [8])scriptCode;
          }
          iVar15 = 0;
          local_68 = data;
          bVar16 = GetScriptOp((const_iterator *)local_68,
                               (uchar *)((long)&(((CScript *)data)->super_CScriptBase)._union +
                                        (long)(int)uVar9),(opcodetype *)&local_88,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
          if (bVar16) {
            iVar15 = 0;
            do {
              iVar15 = iVar15 + (uint)((int)local_88 == 0xab);
              uVar3 = (scriptCode->super_CScriptBase)._size;
              uVar9 = uVar3 - 0x1d;
              if (uVar3 < 0x1d) {
                uVar9 = uVar3;
              }
              pCVar10 = (CScript *)(scriptCode->super_CScriptBase)._union.indirect_contents.indirect
              ;
              if (uVar3 < 0x1d) {
                pCVar10 = scriptCode;
              }
              bVar16 = GetScriptOp((const_iterator *)local_68,
                                   (uchar *)((long)&(pCVar10->super_CScriptBase)._union +
                                            (long)(int)uVar9),(opcodetype *)&local_88,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
            } while (bVar16);
          }
          uVar3 = (scriptCode->super_CScriptBase)._size;
          uVar9 = uVar3 - 0x1d;
          if (uVar3 < 0x1d) {
            uVar9 = uVar3;
          }
          WriteCompactSize<HashWriter>((HashWriter *)local_138,(ulong)(uVar9 - iVar15));
          uVar3 = (scriptCode->super_CScriptBase)._size;
          uVar9 = uVar3 - 0x1d;
          if (uVar3 < 0x1d) {
            uVar9 = uVar3;
          }
          pCVar10 = (CScript *)(scriptCode->super_CScriptBase)._union.indirect_contents.indirect;
          if (uVar3 < 0x1d) {
            pCVar10 = scriptCode;
          }
          local_68 = data;
          bVar16 = GetScriptOp((const_iterator *)local_68,
                               (uchar *)((long)&(pCVar10->super_CScriptBase)._union +
                                        (long)(int)uVar9),(opcodetype *)&local_88,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
          if (bVar16) {
            do {
              if ((int)local_88 == 0xab) {
                CSHA256::Write((CSHA256 *)local_138,(uchar *)data,
                               (long)(int)(~SUB84(data,0) + local_68._0_4_));
                data = local_68;
              }
              uVar3 = (scriptCode->super_CScriptBase)._size;
              uVar9 = uVar3 - 0x1d;
              if (uVar3 < 0x1d) {
                uVar9 = uVar3;
              }
              pCVar10 = (CScript *)(scriptCode->super_CScriptBase)._union.indirect_contents.indirect
              ;
              if (uVar3 < 0x1d) {
                pCVar10 = scriptCode;
              }
              bVar16 = GetScriptOp((const_iterator *)local_68,
                                   (uchar *)((long)&(pCVar10->super_CScriptBase)._union +
                                            (long)(int)uVar9),(opcodetype *)&local_88,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
            } while (bVar16);
          }
          uVar3 = (scriptCode->super_CScriptBase)._size;
          uVar9 = uVar3 - 0x1d;
          if (uVar3 < 0x1d) {
            uVar9 = uVar3;
          }
          pCVar10 = (CScript *)(scriptCode->super_CScriptBase)._union.indirect_contents.indirect;
          if (uVar3 < 0x1d) {
            pCVar10 = scriptCode;
          }
          if (data != (undefined1  [8])((pCVar10->super_CScriptBase)._union.direct + (int)uVar9)) {
            CSHA256::Write((CSHA256 *)local_138,(uchar *)data,(long)(local_68._0_4_ - SUB84(data,0))
                          );
          }
LAB_00419253:
          local_68._0_4_ =
               (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8].nSequence;
        }
        else {
          pStack_60._union.indirect_contents.capacity = 0;
          pStack_60._union._12_4_ = 0;
          pStack_60._union._16_8_ = 0;
          local_68 = (undefined1  [8])0x0;
          pStack_60._union._0_8_ = (void *)0x0;
          SerializeMany<HashWriter,prevector<28u,unsigned_char,unsigned_int,int>>
                    ((HashWriter *)local_138,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_68);
          if (0x1c < (uint)pStack_60._union._20_4_) {
            free((void *)local_68);
          }
          if ((nHashType & 0x1eU) != 2) goto LAB_00419253;
          local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffff00000000);
        }
        CSHA256::Write((CSHA256 *)local_138,(uchar *)local_68,4);
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_148);
    }
    else {
      uVar8 = ((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      local_148 = (uint)uVar8;
      WriteCompactSize<HashWriter>((HashWriter *)local_138,uVar8 & 0xffffffff);
      if (local_148 != 0) goto LAB_00419025;
    }
    if (uVar7 == 2) {
      local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffffff00);
      CSHA256::Write((CSHA256 *)local_138,local_68,1);
    }
    else {
      if (uVar7 == 3) {
        uVar12 = nIn + 1;
      }
      else {
        uVar12 = (int)((ulong)((long)(txTo->vout).
                                     super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
      }
      WriteCompactSize<HashWriter>((HashWriter *)local_138,(ulong)uVar12);
      if (uVar12 != 0) {
        lVar14 = 0;
        do {
          if ((uVar7 == 3) && (uVar13 * 0x28 != lVar14)) {
            CTxOut::CTxOut((CTxOut *)local_68);
            local_88 = (char *)local_68;
            CSHA256::Write((CSHA256 *)local_138,(uchar *)&local_88,8);
            SerializeMany<HashWriter,prevector<28u,unsigned_char,unsigned_int,int>>
                      ((HashWriter *)local_138,&pStack_60);
            if (0x1c < pStack_60._size) {
              free((void *)pStack_60._union._0_8_);
            }
          }
          else {
            puVar2 = (ulong *)((long)&((txTo->vout).
                                       super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                       super__Vector_impl_data._M_start)->nValue + lVar14);
            local_68 = (undefined1  [8])*puVar2;
            CSHA256::Write((CSHA256 *)local_138,(uchar *)local_68,8);
            SerializeMany<HashWriter,prevector<28u,unsigned_char,unsigned_int,int>>
                      ((HashWriter *)local_138,
                       (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(puVar2 + 1));
          }
          lVar14 = lVar14 + 0x28;
        } while ((ulong)uVar12 * 0x28 != lVar14);
      }
    }
    local_68._0_4_ = txTo->nLockTime;
    CSHA256::Write((CSHA256 *)local_138,local_68,4);
    local_68._0_4_ = nHashType;
    CSHA256::Write((CSHA256 *)local_138,local_68,4);
  }
  HashWriter::GetHash(__return_storage_ptr__,(HashWriter *)local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00419775:
  __stack_chk_fail();
}

Assistant:

uint256 SignatureHash(const CScript& scriptCode, const T& txTo, unsigned int nIn, int32_t nHashType, const CAmount& amount, SigVersion sigversion, const PrecomputedTransactionData* cache)
{
    assert(nIn < txTo.vin.size());

    if (sigversion == SigVersion::WITNESS_V0) {
        uint256 hashPrevouts;
        uint256 hashSequence;
        uint256 hashOutputs;
        const bool cacheready = cache && cache->m_bip143_segwit_ready;

        if (!(nHashType & SIGHASH_ANYONECANPAY)) {
            hashPrevouts = cacheready ? cache->hashPrevouts : SHA256Uint256(GetPrevoutsSHA256(txTo));
        }

        if (!(nHashType & SIGHASH_ANYONECANPAY) && (nHashType & 0x1f) != SIGHASH_SINGLE && (nHashType & 0x1f) != SIGHASH_NONE) {
            hashSequence = cacheready ? cache->hashSequence : SHA256Uint256(GetSequencesSHA256(txTo));
        }


        if ((nHashType & 0x1f) != SIGHASH_SINGLE && (nHashType & 0x1f) != SIGHASH_NONE) {
            hashOutputs = cacheready ? cache->hashOutputs : SHA256Uint256(GetOutputsSHA256(txTo));
        } else if ((nHashType & 0x1f) == SIGHASH_SINGLE && nIn < txTo.vout.size()) {
            HashWriter ss{};
            ss << txTo.vout[nIn];
            hashOutputs = ss.GetHash();
        }

        HashWriter ss{};
        // Version
        ss << txTo.version;
        // Input prevouts/nSequence (none/all, depending on flags)
        ss << hashPrevouts;
        ss << hashSequence;
        // The input being signed (replacing the scriptSig with scriptCode + amount)
        // The prevout may already be contained in hashPrevout, and the nSequence
        // may already be contain in hashSequence.
        ss << txTo.vin[nIn].prevout;
        ss << scriptCode;
        ss << amount;
        ss << txTo.vin[nIn].nSequence;
        // Outputs (none/one/all, depending on flags)
        ss << hashOutputs;
        // Locktime
        ss << txTo.nLockTime;
        // Sighash type
        ss << nHashType;

        return ss.GetHash();
    }

    // Check for invalid use of SIGHASH_SINGLE
    if ((nHashType & 0x1f) == SIGHASH_SINGLE) {
        if (nIn >= txTo.vout.size()) {
            //  nOut out of range
            return uint256::ONE;
        }
    }

    // Wrapper to serialize only the necessary parts of the transaction being signed
    CTransactionSignatureSerializer<T> txTmp(txTo, scriptCode, nIn, nHashType);

    // Serialize and hash
    HashWriter ss{};
    ss << txTmp << nHashType;
    return ss.GetHash();
}